

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMipsInstruction.cpp
# Opt level: O0

int getImmediateBits(MipsImmediateType type)

{
  int local_c;
  MipsImmediateType type_local;
  
  switch(type) {
  case Immediate5:
    local_c = 5;
    break;
  case Immediate10:
    local_c = 10;
    break;
  case Immediate16:
  case ImmediateHalfFloat:
    local_c = 0x10;
    break;
  case Immediate20:
  case Immediate20_0:
    local_c = 0x14;
    break;
  case Immediate25:
    local_c = 0x19;
    break;
  case Immediate26:
    local_c = 0x1a;
    break;
  case Immediate7:
    local_c = 7;
    break;
  default:
    local_c = 0;
  }
  return local_c;
}

Assistant:

int getImmediateBits(MipsImmediateType type)
{
	switch (type)
	{
	case MipsImmediateType::Immediate5:
		return 5;
	case MipsImmediateType::Immediate7:
		return 7;
	case MipsImmediateType::Immediate10:
		return 10;
	case MipsImmediateType::Immediate16:
	case MipsImmediateType::ImmediateHalfFloat:
		return 16;
	case MipsImmediateType::Immediate20:
	case MipsImmediateType::Immediate20_0:
		return 20;
	case MipsImmediateType::Immediate25:
		return 25;
	case MipsImmediateType::Immediate26:
		return 26;
	default:
		return 0;
	}
}